

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

double __thiscall FIX::DoubleField::getValue(DoubleField *this)

{
  string *value;
  double dVar1;
  FieldConvertError *anon_var_0;
  DoubleField *this_local;
  
  value = FieldBase::getString_abi_cxx11_(&this->super_FieldBase);
  dVar1 = DoubleConvertor::convert(value);
  return dVar1;
}

Assistant:

EXCEPT(IncorrectDataFormat) {
    try {
      return DoubleConvertor::convert(getString());
    } catch (FieldConvertError &) {
      throw IncorrectDataFormat(getTag(), getString());
    }
  }